

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O3

iterator __thiscall
QJsonObject::insertImpl<QLatin1String>(QJsonObject *this,QLatin1String key,QJsonValue *value)

{
  QCborContainerPrivate *pQVar1;
  Type TVar2;
  qsizetype pos;
  ulong uVar3;
  long in_FS_OFFSET;
  iterator iVar4;
  bool keyExists;
  bool local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = QJsonValue::type(value);
  if (TVar2 == Undefined) {
    removeImpl<QLatin1String>(this,key);
    detach(this,0);
    pQVar1 = (this->o).d.ptr;
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      uVar3 = 1;
    }
    else {
      uVar3 = (pQVar1->elements).d.size | 1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar4.item.super_QJsonValueConstRef._8_8_ = uVar3;
      iVar4.item.super_QJsonValueConstRef.field_0.o = this;
      return (iterator)iVar4.item.super_QJsonValueConstRef;
    }
  }
  else {
    local_31 = false;
    if ((this->o).d.ptr == (QCborContainerPrivate *)0x0) {
      pos = 0;
    }
    else {
      pos = indexOf<QLatin1String>(&this->o,key,&local_31);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      iVar4 = insertAt<QLatin1String>(this,pos,key,value,(bool)(local_31 & 1));
      return (QJsonValueRef)(QJsonValueRef)iVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::insertImpl(T key, const QJsonValue &value)
{
    if (value.type() == QJsonValue::Undefined) {
        remove(key);
        return end();
    }
    bool keyExists = false;
    auto pos = o ? indexOf(o, key, &keyExists) : 0;
    return insertAt(pos, key, value, keyExists);
}